

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Action
          (Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this,
          ActionInterface<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *impl
          )

{
  __shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(pstore::gsl::span<int,-1l>)>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>,void>
            (local_20,impl);
  std::function<pstore::serialize::archive::void_type(pstore::gsl::span<int,-1l>)>::
  function<testing::Action<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>::ActionAdapter,void>
            ((function<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)> *)this,
             (ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}